

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

istream * operator>>(istream *in,Company *company)

{
  int iVar1;
  int local_1c;
  int i;
  Company *company_local;
  istream *in_local;
  
  std::istream::operator>>((istream *)in,&company->budget);
  operator>>(in,company->boss);
  local_1c = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(company->boss);
    if (iVar1 <= local_1c) break;
    operator>>(in,company->employees[local_1c]);
    local_1c = local_1c + 1;
  }
  return in;
}

Assistant:

istream &operator>>(istream &in, Company &company) {
    in >> company.budget;
    in >> (*company.boss);
    for (int i = 0; i < company.boss->getNumberOfEmployees(); ++i) {
        in >> (*company.employees[i]);
    }
    return in;
}